

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

BoundingBox * Assimp::IFC::GetBoundingBox(BoundingBox *__return_storage_ptr__,Polygon *poly)

{
  bool bVar1;
  aiVector2t<double> aVar2;
  double local_c8;
  double local_c0;
  double local_b8;
  aiVector2t<double> local_a8;
  aiVector2t<double> local_98;
  aiVector2t<double> local_88;
  aiVector2t<double> local_78;
  undefined1 local_68 [8];
  IfcVector2 vv;
  IntPoint *point;
  const_iterator __end2;
  const_iterator __begin2;
  Polygon *__range2;
  undefined1 local_30 [8];
  IfcVector2 newbb_max;
  IfcVector2 newbb_min;
  Polygon *poly_local;
  
  aiVector2t<double>::aiVector2t((aiVector2t<double> *)&newbb_max.y);
  aiVector2t<double>::aiVector2t((aiVector2t<double> *)local_30);
  MinMaxChooser<aiVector2t<double>_>::operator()
            ((MinMaxChooser<aiVector2t<double>_> *)((long)&__range2 + 7),
             (aiVector2t<double> *)&newbb_max.y,(aiVector2t<double> *)local_30);
  __end2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin(poly);
  point = (IntPoint *)
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end(poly);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                                *)&point);
    if (!bVar1) break;
    vv.y = (double)__gnu_cxx::
                   __normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                   ::operator*(&__end2);
    aiVector2t<double>::aiVector2t
              ((aiVector2t<double> *)local_68,(double)((reference)vv.y)->X / 1518500249.0,
               (double)((reference)vv.y)->Y / 1518500249.0);
    aiVector2t<double>::aiVector2t(&local_88);
    local_78 = std::max<double>((aiVector2t<double> *)local_68,&local_88);
    local_68 = (undefined1  [8])local_78.x;
    vv.x = local_78.y;
    aiVector2t<double>::aiVector2t(&local_a8,1.0,1.0);
    local_98 = std::min<double>((aiVector2t<double> *)local_68,&local_a8);
    local_68 = (undefined1  [8])local_98.x;
    vv.x = local_98.y;
    aVar2 = std::min<double>((aiVector2t<double> *)&newbb_max.y,(aiVector2t<double> *)local_68);
    local_b8 = aVar2.x;
    newbb_max.y = local_b8;
    aVar2 = std::max<double>((aiVector2t<double> *)local_30,(aiVector2t<double> *)local_68);
    local_c8 = aVar2.x;
    local_30 = (undefined1  [8])local_c8;
    local_c0 = aVar2.y;
    newbb_max.x = local_c0;
    __gnu_cxx::
    __normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
    ::operator++(&__end2);
  }
  std::pair<aiVector2t<double>,_aiVector2t<double>_>::
  pair<aiVector2t<double>_&,_aiVector2t<double>_&,_true>
            (__return_storage_ptr__,(aiVector2t<double> *)&newbb_max.y,
             (aiVector2t<double> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

BoundingBox GetBoundingBox(const ClipperLib::Polygon& poly)
{
    IfcVector2 newbb_min, newbb_max;
    MinMaxChooser<IfcVector2>()(newbb_min, newbb_max);

    for(const ClipperLib::IntPoint& point : poly) {
        IfcVector2 vv = IfcVector2( from_int64(point.X), from_int64(point.Y));

        // sanity rounding
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);

        newbb_min = std::min(newbb_min,vv);
        newbb_max = std::max(newbb_max,vv);
    }
    return BoundingBox(newbb_min, newbb_max);
}